

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddKmap.c
# Opt level: O3

void Extra_PrintKMapRelation
               (FILE *Output,DdManager *dd,DdNode *OnSet,DdNode *OffSet,int nXVars,int nYVars,
               DdNode **XVars,DdNode **YVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  DdNode *n;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *n_00;
  DdNode *n_01;
  uint uVar6;
  size_t __size;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint Code;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  int local_98;
  
  iVar1 = Cudd_bddLeq(dd,OnSet,(DdNode *)((ulong)OffSet ^ 1));
  if (iVar1 == 0) {
    pcVar7 = "PrintKMap(): The on-set and the off-set overlap\n";
    __size = 0x30;
  }
  else {
    if (dd->one == OnSet) {
      pcVar7 = "PrintKMap(): Constant 1\n";
    }
    else {
      if (dd->one != OffSet) {
        if (0x14 < (uint)(nXVars + nYVars)) {
          fprintf((FILE *)Output,
                  "PrintKMap(): The number of variables is less than zero or more than %d\n",0x14);
          return;
        }
        uVar6 = 1 << ((byte)nXVars & 0x1f);
        uVar2 = 1 << ((byte)nYVars & 0x1f);
        fputc(10,(FILE *)Output);
        if (0 < nXVars) {
          iVar9 = nYVars + 0x61;
          iVar1 = nXVars;
          do {
            fputc(iVar9,(FILE *)Output);
            iVar9 = iVar9 + 1;
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        fwrite(" \\ ",3,1,(FILE *)Output);
        if (nYVars < 1) {
          fputc(10,(FILE *)Output);
        }
        else {
          iVar1 = 0x61;
          do {
            fputc(iVar1,(FILE *)Output);
            iVar9 = iVar1 - nYVars;
            iVar1 = iVar1 + 1;
          } while (iVar9 != 0x60);
          fputc(10,(FILE *)Output);
          if (0 < nYVars) {
            iVar1 = nXVars + 2;
            local_98 = 0;
            if (iVar1 < 1) {
              iVar1 = 0;
            }
            uVar12 = 1;
            if (1 < (int)uVar2) {
              uVar12 = uVar2;
            }
            do {
              iVar9 = iVar1 + 1;
              if (-3 < nXVars) {
                do {
                  fputc(0x20,(FILE *)Output);
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
              if (nYVars != 0x1f) {
                uVar8 = 0;
                do {
                  pcVar7 = "On1   ";
                  if (((uVar8 >> 1 ^ uVar8) & 1 << (~(byte)local_98 + (byte)nYVars & 0x1f)) == 0) {
                    pcVar7 = "On0   ";
                  }
                  fwrite(pcVar7 + 2,4,1,(FILE *)Output);
                  uVar8 = uVar8 + 1;
                } while (uVar12 != uVar8);
              }
              fputc(10,(FILE *)Output);
              local_98 = local_98 + 1;
            } while (local_98 != nYVars);
          }
        }
        if (-1 < nXVars) {
          iVar1 = nXVars + 1;
          do {
            fputc(0x20,(FILE *)Output);
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        fputc(0x2b,(FILE *)Output);
        if (nYVars != 0x1f) {
          uVar12 = 1;
          if (1 < (int)uVar2) {
            uVar12 = uVar2;
          }
          uVar8 = 0;
          do {
            fputc(0x2d,(FILE *)Output);
            fputc(0x2d,(FILE *)Output);
            fputc(0x2d,(FILE *)Output);
            if (uVar2 - 1 != uVar8) {
              fputc(0x2b,(FILE *)Output);
            }
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
        }
        fputc(0x2b,(FILE *)Output);
        fputc(10,(FILE *)Output);
        if (nXVars != 0x1f) {
          uVar8 = uVar6 - 1;
          uVar12 = 1;
          if (1 < (int)uVar2) {
            uVar12 = uVar2;
          }
          if ((int)uVar6 < 2) {
            uVar6 = 1;
          }
          uVar3 = uVar2 - 1;
          uVar13 = 0;
          do {
            uVar10 = (uint)uVar13;
            Code = (uint)(uVar13 >> 1) ^ uVar10;
            uVar11 = nXVars - 1;
            if (0 < nXVars) {
              do {
                fputc(((Code >> (uVar11 & 0x1f) & 1) != 0) + 0x30,(FILE *)Output);
                bVar14 = uVar11 != 0;
                uVar11 = uVar11 - 1;
              } while (bVar14);
            }
            fputc(0x20,(FILE *)Output);
            n = Extra_bddBitsToCube(dd,Code,nXVars,XVars,1);
            Cudd_Ref(n);
            fputc(0x7c,(FILE *)Output);
            if (nYVars != 0x1f) {
              uVar11 = 0;
              do {
                fputc(0x20,(FILE *)Output);
                pDVar4 = Extra_bddBitsToCube(dd,uVar11 >> 1 ^ uVar11,nYVars,YVars,1);
                Cudd_Ref(pDVar4);
                pDVar5 = Cudd_bddAnd(dd,pDVar4,n);
                Cudd_Ref(pDVar5);
                Cudd_RecursiveDeref(dd,pDVar4);
                n_00 = Cudd_Cofactor(dd,OnSet,pDVar5);
                Cudd_Ref(n_00);
                n_01 = Cudd_Cofactor(dd,OffSet,pDVar5);
                Cudd_Ref(n_01);
                Cudd_RecursiveDeref(dd,pDVar5);
                pDVar4 = dd->one;
                pDVar5 = (DdNode *)((ulong)pDVar4 ^ 1);
                if (((((n_00 != pDVar4) || (iVar1 = 0x31, n_01 != pDVar5)) &&
                     ((n_01 != pDVar4 || (iVar1 = 0x20, n_00 != pDVar5)))) &&
                    ((n_00 != pDVar5 || (iVar1 = 0x2d, n_01 != pDVar5)))) &&
                   ((n_00 != pDVar4 || (iVar1 = 0x3f, n_01 != pDVar4)))) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddKmap.c"
                                ,0x2d9,
                                "void Extra_PrintKMapRelation(FILE *, DdManager *, DdNode *, DdNode *, int, int, DdNode **, DdNode **)"
                               );
                }
                fputc(iVar1,(FILE *)Output);
                Cudd_RecursiveDeref(dd,n_00);
                Cudd_RecursiveDeref(dd,n_01);
                fputc(0x20,(FILE *)Output);
                if (uVar3 != uVar11) {
                  fputc(0x7c,(FILE *)Output);
                }
                uVar11 = uVar11 + 1;
              } while (uVar12 != uVar11);
            }
            fputc(0x7c,(FILE *)Output);
            fputc(10,(FILE *)Output);
            Cudd_RecursiveDeref(dd,n);
            if (uVar10 != uVar8) {
              iVar1 = nXVars + 1;
              if (-1 < nXVars) {
                do {
                  fputc(0x20,(FILE *)Output);
                  iVar1 = iVar1 + -1;
                } while (iVar1 != 0);
              }
              fputc(0x2b,(FILE *)Output);
              if ((uVar13 & 1) == 0) {
                if (nYVars != 0x1f) {
                  uVar11 = 0;
                  do {
                    fputc(0x2d,(FILE *)Output);
                    fputc(0x2d,(FILE *)Output);
                    fputc(0x2d,(FILE *)Output);
                    if (uVar3 != uVar11) {
                      fputc(0x2b,(FILE *)Output);
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar12 != uVar11);
                }
              }
              else if (nYVars != 0x1f) {
                uVar11 = 0;
                do {
                  fputc(0x2d,(FILE *)Output);
                  fputc(0x2d,(FILE *)Output);
                  fputc(0x2d,(FILE *)Output);
                  if (uVar3 != uVar11) {
                    fputc(0x2b,(FILE *)Output);
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar12 != uVar11);
              }
              fputc(0x2b,(FILE *)Output);
              fputc(10,(FILE *)Output);
            }
            uVar13 = (ulong)(uVar10 + 1);
          } while (uVar10 + 1 != uVar6);
          if (nXVars < 0) goto LAB_007b635c;
        }
        iVar1 = nXVars + 1;
        do {
          fputc(0x20,(FILE *)Output);
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
LAB_007b635c:
        fputc(0x2b,(FILE *)Output);
        if (nYVars != 0x1f) {
          uVar6 = 1;
          if (1 < (int)uVar2) {
            uVar6 = uVar2;
          }
          uVar12 = 0;
          do {
            fputc(0x2d,(FILE *)Output);
            fputc(0x2d,(FILE *)Output);
            fputc(0x2d,(FILE *)Output);
            if (uVar2 - 1 != uVar12) {
              fputc(0x2b,(FILE *)Output);
            }
            uVar12 = uVar12 + 1;
          } while (uVar6 != uVar12);
        }
        fputc(0x2b,(FILE *)Output);
        fputc(10,(FILE *)Output);
        return;
      }
      pcVar7 = "PrintKMap(): Constant 0\n";
    }
    __size = 0x18;
  }
  fwrite(pcVar7,__size,1,(FILE *)Output);
  return;
}

Assistant:

void Extra_PrintKMapRelation( 
  FILE * Output,  /* the output stream */
  DdManager * dd, 
  DdNode * OnSet, 
  DdNode * OffSet, 
  int nXVars, 
  int nYVars, 
  DdNode ** XVars, 
  DdNode ** YVars ) /* the flag which determines how support is computed */
{
    int d, p, n, s, v, h, w;
    int nVars;
    int nVarsVer;
    int nVarsHor;
    int nCellsVer;
    int nCellsHor;
    int nSkipSpaces;

    // make sure that on-set and off-set do not overlap
    if ( !Cudd_bddLeq( dd, OnSet, Cudd_Not(OffSet) ) )
    {
        fprintf( Output, "PrintKMap(): The on-set and the off-set overlap\n" );
        return;
    }

    if ( OnSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 1\n" );
        return;
    }
    if ( OffSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 0\n" );
        return;
    }

    nVars = nXVars + nYVars;
    if ( nVars < 0 || nVars > MAXVARS )
    {
        fprintf( Output, "PrintKMap(): The number of variables is less than zero or more than %d\n", MAXVARS );
        return;
    }


    ////////////////////////////////////////////////////////////////////
    // determine the Karnaugh map parameters
    nVarsVer = nXVars;
    nVarsHor = nYVars;
    nCellsVer = (1<<nVarsVer);
    nCellsHor = (1<<nVarsHor);
    nSkipSpaces = nVarsVer + 1;

    ////////////////////////////////////////////////////////////////////
    // print variable names
    fprintf( Output, "\n" );
    for ( w = 0; w < nVarsVer; w++ )
        fprintf( Output, "%c", 'a'+nVarsHor+w );
    if ( fHorizontalVarNamesPrintedAbove )
    {
        fprintf( Output, " \\ " );
        for ( w = 0; w < nVarsHor; w++ )
            fprintf( Output, "%c", 'a'+w );
    }
    fprintf( Output, "\n" );

    if ( fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );
            fprintf( Output, "\n" );
        }
    }

    ////////////////////////////////////////////////////////////////////
    // print the upper line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_TOP_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_BOT );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_BOT );
        }
    }
    fprintf( Output, "%c", DOUBLE_TOP_RIGHT );
    fprintf( Output, "\n" );

    ////////////////////////////////////////////////////////////////////
    // print the map
    for ( v = 0; v < nCellsVer; v++ )
    {
        DdNode * CubeVerBDD;

        // print horizontal digits
//      for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
        for ( n = 0; n < nVarsVer; n++ )
            if ( GrayCode(v) & (1<<(nVarsVer-1-n)) )
                fprintf( Output, "1" );
            else
                fprintf( Output, "0" );
        fprintf( Output, " " );

        // find vertical cube
//      CubeVerBDD = Extra_bddBitsToCube( dd, GrayCode(v), nVarsVer, s_XVars+nVarsHor );    Cudd_Ref( CubeVerBDD );
        CubeVerBDD = Extra_bddBitsToCube( dd, GrayCode(v), nXVars, XVars, 1 );                 Cudd_Ref( CubeVerBDD );

        // print text line
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        for ( h = 0; h < nCellsHor; h++ )
        {
            DdNode * CubeHorBDD, * Prod, * ValueOnSet, * ValueOffSet;

            fprintf( Output, " " );
//          fprintf( Output, "x" );
            ///////////////////////////////////////////////////////////////
            // determine what should be printed
//          CubeHorBDD  = Extra_bddBitsToCube( dd, GrayCode(h), nVarsHor, s_XVars );    Cudd_Ref( CubeHorBDD );
            CubeHorBDD  = Extra_bddBitsToCube( dd, GrayCode(h), nYVars, YVars, 1 );        Cudd_Ref( CubeHorBDD );
            Prod = Cudd_bddAnd( dd, CubeHorBDD, CubeVerBDD );                           Cudd_Ref( Prod );
            Cudd_RecursiveDeref( dd, CubeHorBDD );

            ValueOnSet  = Cudd_Cofactor( dd, OnSet, Prod );                     Cudd_Ref( ValueOnSet );
            ValueOffSet = Cudd_Cofactor( dd, OffSet, Prod );                    Cudd_Ref( ValueOffSet );
            Cudd_RecursiveDeref( dd, Prod );

            if ( ValueOnSet == b1 && ValueOffSet == b0 )
                fprintf( Output, "%c", SYMBOL_ONE );
            else if ( ValueOnSet == b0 && ValueOffSet == b1 )
                fprintf( Output, "%c", SYMBOL_ZERO );
            else if ( ValueOnSet == b0 && ValueOffSet == b0 ) 
                fprintf( Output, "%c", SYMBOL_DC );
            else if ( ValueOnSet == b1 && ValueOffSet == b1 ) 
                fprintf( Output, "%c", SYMBOL_OVERLAP );
            else
                assert(0);

            Cudd_RecursiveDeref( dd, ValueOnSet );
            Cudd_RecursiveDeref( dd, ValueOffSet );
            ///////////////////////////////////////////////////////////////
            fprintf( Output, " " );

            if ( h != nCellsHor-1 )
            {
                if ( h&1 )
                    fprintf( Output, "%c", DOUBLE_VERTICAL );
                else
                    fprintf( Output, "%c", SINGLE_VERTICAL );
            }
        }
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        fprintf( Output, "\n" );

        Cudd_RecursiveDeref( dd, CubeVerBDD );

        if ( v != nCellsVer-1 )
        // print separator line
        {
            for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
            if ( v&1 )
            {
                fprintf( Output, "%c", D_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", DOUBLES_CROSS );
                        else
                            fprintf( Output, "%c", S_VER_CROSS_D_HOR );
                    }
                }
                fprintf( Output, "%c", D_JOINS_D_VER_LEFT );
            }
            else
            {
                fprintf( Output, "%c", S_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", S_HOR_CROSS_D_VER );
                        else
                            fprintf( Output, "%c", SINGLES_CROSS );
                    }
                }
                fprintf( Output, "%c", S_JOINS_D_VER_LEFT );
            }
            fprintf( Output, "\n" );
        }
    }
    
    ////////////////////////////////////////////////////////////////////
    // print the lower line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_BOT_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_TOP );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_TOP );
        }
    }
    fprintf( Output, "%c", DOUBLE_BOT_RIGHT );
    fprintf( Output, "\n" );

    if ( !fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );

            /////////////////////////////////
            fprintf( Output, "%c", (char)('a'+d) );
            /////////////////////////////////
            fprintf( Output, "\n" );
        }
    }
}